

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureStateQueryTests.cpp
# Opt level: O2

void __thiscall
deqp::gls::TextureStateQueryTests::anon_unknown_1::RequiredExtensions::check
          (RequiredExtensions *this,ContextInfo *ctxInfo)

{
  pointer ppcVar1;
  bool bVar2;
  NotSupportedError *this_00;
  long lVar3;
  int ndx;
  long lVar4;
  int ndx_1;
  vector<const_char_*,_std::allocator<const_char_*>_> failedExtensions;
  string local_1c8;
  ostringstream buf;
  
  failedExtensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  failedExtensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  failedExtensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar3 = 0;
  for (lVar4 = 0;
      ppcVar1 = (this->m_extensions).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                ._M_impl.super__Vector_impl_data._M_start,
      lVar4 < (int)((ulong)((long)(this->m_extensions).
                                  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                                  _M_impl.super__Vector_impl_data._M_finish - (long)ppcVar1) >> 3);
      lVar4 = lVar4 + 1) {
    bVar2 = glu::ContextInfo::isExtensionSupported(ctxInfo,*(char **)((long)ppcVar1 + lVar3));
    if (!bVar2) {
      std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                (&failedExtensions,
                 (value_type *)
                 ((long)(this->m_extensions).
                        super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                        super__Vector_impl_data._M_start + lVar3));
    }
    lVar3 = lVar3 + 8;
  }
  if (failedExtensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start ==
      failedExtensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
              (&failedExtensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>);
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&buf);
  std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,
                  "Test requires extension: ");
  lVar3 = 0;
  while( true ) {
    if ((int)((ulong)((long)failedExtensions.
                            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)failedExtensions.
                           super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                           super__Vector_impl_data._M_start) >> 3) <= lVar3) break;
    if (lVar3 != 0) {
      std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,", ");
    }
    std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,
                    failedExtensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar3]);
    lVar3 = lVar3 + 1;
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  std::__cxx11::stringbuf::str();
  tcu::NotSupportedError::NotSupportedError(this_00,&local_1c8);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void RequiredExtensions::check (const glu::ContextInfo& ctxInfo) const
{
	std::vector<const char*> failedExtensions;

	for (int ndx = 0; ndx < (int)m_extensions.size(); ++ndx)
		if (!ctxInfo.isExtensionSupported(m_extensions[ndx]))
			failedExtensions.push_back(m_extensions[ndx]);

	if (!failedExtensions.empty())
	{
		std::ostringstream buf;
		buf << "Test requires extension: ";

		for (int ndx = 0; ndx < (int)failedExtensions.size(); ++ndx)
		{
			if (ndx)
				buf << ", ";
			buf << failedExtensions[ndx];
		}

		throw tcu::NotSupportedError(buf.str());
	}
}